

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

Expression * __thiscall
soul::heart::Parser::checkExpressionType
          (Parser *this,Expression *r,Type *requiredType,CodeLocation *errorPos)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string local_c0;
  Value constValue;
  CompileMessage local_60;
  
  (*(r->super_Object)._vptr_Object[7])(&constValue);
  if (constValue.type.category != invalid) {
    bVar1 = TypeRules::canSilentlyCastTo(requiredType,&constValue);
    if (bVar1) goto LAB_002512e3;
  }
  iVar2 = (*(r->super_Object)._vptr_Object[2])(r);
  bVar1 = TypeRules::canPassAsArgumentTo(requiredType,(Type *)CONCAT44(extraout_var,iVar2),true);
  if (!bVar1) {
    getTypeDescription_abi_cxx11_(&local_c0,this,requiredType);
    Errors::expectedExpressionOfType<std::__cxx11::string>(&local_60,(Errors *)&local_c0,args);
    CodeLocation::throwError(errorPos,&local_60);
  }
LAB_002512e3:
  soul::Value::~Value(&constValue);
  return r;
}

Assistant:

heart::Expression& checkExpressionType (heart::Expression& r, const Type& requiredType, const CodeLocation& errorPos)
    {
        auto constValue = r.getAsConstant();

        if (constValue.isValid() && TypeRules::canSilentlyCastTo (requiredType, constValue))
            return r;

        if (! TypeRules::canPassAsArgumentTo (requiredType, r.getType(), true))
            errorPos.throwError (Errors::expectedExpressionOfType (getTypeDescription (requiredType)));

        return r;
    }